

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfd.h
# Opt level: O2

void __thiscall pfd::settings::settings(settings *this,bool resync)

{
  bool bVar1;
  char *__lhs;
  undefined1 *puVar2;
  allocator local_39;
  string local_38;
  
  flags(pfd::settings::flag)::flags._0_1_ = !resync & (byte)flags(pfd::settings::flag)::flags;
  if ((byte)flags(pfd::settings::flag)::flags != 0) {
    return;
  }
  std::__cxx11::string::string((string *)&local_38,"zenity",&local_39);
  flags(pfd::settings::flag)::flags._2_1_ = check_program(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"matedialog",&local_39);
  flags(pfd::settings::flag)::flags._3_1_ = check_program(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"qarma",&local_39);
  flags(pfd::settings::flag)::flags._4_1_ = check_program(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"kdialog",&local_39);
  flags(pfd::settings::flag)::flags._5_1_ = check_program(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (((flags(pfd::settings::flag)::flags._2_1_ == '\x01') &&
      (flags(pfd::settings::flag)::flags._5_1_ == '\x01')) &&
     (__lhs = getenv("XDG_SESSION_DESKTOP"), __lhs != (char *)0x0)) {
    std::__cxx11::string::string((string *)&local_38,"gnome",&local_39);
    bVar1 = std::operator==(__lhs,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      puVar2 = (undefined1 *)((long)&flags(pfd::settings::flag)::flags + 5);
    }
    else {
      std::__cxx11::string::string((string *)&local_38,"KDE",&local_39);
      bVar1 = std::operator==(__lhs,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (!bVar1) {
        flags(pfd::settings::flag)::flags._0_1_ = 1;
        return;
      }
      puVar2 = (undefined1 *)((long)&flags(pfd::settings::flag)::flags + 2);
    }
    *puVar2 = 0;
  }
  flags(pfd::settings::flag)::flags._0_1_ = 1;
  return;
}

Assistant:

inline settings::settings(bool resync)
{
    flags(flag::is_scanned) &= !resync;

    if (flags(flag::is_scanned))
        return;

#if _WIN32
    flags(flag::is_vista) = internal::is_vista();
#elif !__APPLE__
    flags(flag::has_zenity) = check_program("zenity");
    flags(flag::has_matedialog) = check_program("matedialog");
    flags(flag::has_qarma) = check_program("qarma");
    flags(flag::has_kdialog) = check_program("kdialog");

    // If multiple helpers are available, try to default to the best one
    if (flags(flag::has_zenity) && flags(flag::has_kdialog))
    {
        auto desktop_name = std::getenv("XDG_SESSION_DESKTOP");
        if (desktop_name && desktop_name == std::string("gnome"))
            flags(flag::has_kdialog) = false;
        else if (desktop_name && desktop_name == std::string("KDE"))
            flags(flag::has_zenity) = false;
    }
#endif

    flags(flag::is_scanned) = true;
}